

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O0

bool __thiscall
libtorrent::anon_unknown_5::ut_metadata_plugin::received_metadata
          (ut_metadata_plugin *this,ut_metadata_peer_plugin *source,span<const_char> buf,int piece,
          int total_size)

{
  bt_peer_connection *this_00;
  torrent *ptVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  session_interface *psVar7;
  undefined4 extraout_var;
  ulong uVar8;
  index_type iVar9;
  index_type iVar10;
  value_type *__dest;
  char *__src;
  unsigned_long __n;
  value_type *pvVar11;
  iterator iVar12;
  iterator iVar13;
  size_type sVar14;
  element_type *this_01;
  int local_f4;
  duration<long,_std::ratio<60L,_1L>_> local_f0;
  time_point local_e8;
  undefined4 local_dc;
  undefined1 local_d8 [8];
  shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin> peer;
  metadata_piece *mp;
  iterator __end4;
  iterator __begin4;
  vector<metadata_piece> *__range4;
  time_point tStack_a0;
  bool single_peer;
  time_point now;
  undefined1 local_68 [7];
  bool have_all;
  span<const_char> local_58;
  span<const_char> local_48;
  uint local_38;
  uint local_34;
  int total_size_local;
  int piece_local;
  ut_metadata_peer_plugin *source_local;
  ut_metadata_plugin *this_local;
  span<const_char> buf_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (ut_metadata_plugin *)buf.m_ptr;
  local_38 = total_size;
  local_34 = piece;
  _total_size_local = source;
  source_local = (ut_metadata_peer_plugin *)this;
  bVar4 = libtorrent::aux::torrent::valid_metadata(this->m_torrent);
  if (bVar4) {
    libtorrent::aux::peer_connection::peer_log
              (&_total_size_local->m_pc->super_peer_connection,info,"UT_METADATA",
               "already have metadata");
    ptVar1 = this->m_torrent;
    iVar9 = span<const_char>::size((span<const_char> *)&this_local);
    libtorrent::aux::torrent::add_redundant_bytes(ptVar1,(int)iVar9,piece_unknown);
    return false;
  }
  bVar4 = ::std::vector<char,_std::allocator<char>_>::empty
                    (&(this->m_metadata).super_vector<char,_std::allocator<char>_>);
  uVar2 = local_38;
  if (bVar4) {
    if (0 < (int)local_38) {
      psVar7 = libtorrent::aux::torrent::session(this->m_torrent);
      iVar5 = (*(psVar7->super_session_logger)._vptr_session_logger[0x2e])();
      iVar5 = libtorrent::aux::session_settings::get_int
                        ((session_settings *)CONCAT44(extraout_var,iVar5),0x4064);
      if ((int)uVar2 <= iVar5) {
        libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>::
        resize<int,void>((container_wrapper<char,int,std::vector<char,std::allocator<char>>> *)
                         &this->m_metadata,local_38);
        iVar5 = div_round_up(local_38,0x4000);
        libtorrent::aux::
        container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
        ::resize<int,void>((container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
                            *)&this->m_requested_metadata,iVar5);
        goto LAB_007caf12;
      }
    }
    libtorrent::aux::peer_connection::peer_log
              (&_total_size_local->m_pc->super_peer_connection,info,"UT_METADATA",
               "metadata size too big: %d",(ulong)local_38);
    buf_local.m_len._7_1_ = false;
  }
  else {
LAB_007caf12:
    uVar2 = local_34;
    if (((int)local_34 < 0) ||
       (iVar5 = libtorrent::aux::
                container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_int,_std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>_>
                ::end_index(&this->m_requested_metadata), uVar3 = local_38, iVar5 <= (int)uVar2)) {
      libtorrent::aux::peer_connection::peer_log
                (&_total_size_local->m_pc->super_peer_connection,info,"UT_METADATA",
                 "piece: %d INVALID",(ulong)local_34);
      buf_local.m_len._7_1_ = false;
    }
    else {
      uVar6 = libtorrent::aux::
              container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::end_index
                        (&this->m_metadata);
      uVar2 = local_38;
      if (uVar3 == uVar6) {
        iVar5 = local_34 << 0xe;
        iVar9 = span<const_char>::size((span<const_char> *)&this_local);
        local_58 = metadata(this);
        iVar10 = span<const_char>::size(&local_58);
        if (iVar10 < iVar5 + iVar9) {
          buf_local.m_len._7_1_ = false;
        }
        else {
          __dest = libtorrent::aux::
                   container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::
                   operator[](&this->m_metadata,local_34 << 0xe);
          __src = span<const_char>::data((span<const_char> *)&this_local);
          iVar9 = span<const_char>::size((span<const_char> *)&this_local);
          __n = libtorrent::aux::numeric_cast<unsigned_long,long,void>(iVar9);
          memcpy(__dest,__src,__n);
          iVar5 = ::std::numeric_limits<int>::max();
          pvVar11 = libtorrent::aux::
                    container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_int,_std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>_>
                    ::operator[](&this->m_requested_metadata,local_34);
          pvVar11->num_requests = iVar5;
          ::std::enable_shared_from_this<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>
          ::shared_from_this((enable_shared_from_this<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>
                              *)local_68);
          pvVar11 = libtorrent::aux::
                    container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_int,_std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>_>
                    ::operator[](&this->m_requested_metadata,local_34);
          ::std::weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>::operator=
                    (&pvVar11->source,
                     (shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin> *)
                     local_68);
          ::std::shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>::~shared_ptr
                    ((shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin> *)
                     local_68);
          iVar12 = ::std::
                   vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                   ::begin(&(this->m_requested_metadata).
                            super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                          );
          iVar13 = ::std::
                   vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                   ::end(&(this->m_requested_metadata).
                          super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                        );
          bVar4 = ::std::
                  all_of<__gnu_cxx::__normal_iterator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece*,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>,libtorrent::(anonymous_namespace)::ut_metadata_plugin::received_metadata(libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin&,libtorrent::span<char_const>,int,int)::__0>
                            (iVar12._M_current,iVar13._M_current);
          if (bVar4) {
            ptVar1 = this->m_torrent;
            span<char_const>::
            span<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,char,void>
                      ((span<char_const> *)&now,&this->m_metadata);
            bVar4 = libtorrent::aux::torrent::set_metadata(ptVar1,_now);
            if (bVar4) {
              ::std::vector<char,_std::allocator<char>_>::clear
                        (&(this->m_metadata).super_vector<char,_std::allocator<char>_>);
              ::std::vector<char,_std::allocator<char>_>::shrink_to_fit
                        (&(this->m_metadata).super_vector<char,_std::allocator<char>_>);
              ::std::
              vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
              ::clear(&(this->m_requested_metadata).
                       super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                     );
              ::std::
              vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
              ::shrink_to_fit(&(this->m_requested_metadata).
                               super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                             );
              buf_local.m_len._7_1_ = true;
            }
            else {
              bVar4 = libtorrent::aux::torrent::valid_metadata(this->m_torrent);
              if (!bVar4) {
                tStack_a0 = libtorrent::aux::time_now();
                sVar14 = ::std::
                         vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                         ::size(&(this->m_requested_metadata).
                                 super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                               );
                __end4 = ::std::
                         vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                         ::begin(&(this->m_requested_metadata).
                                  super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                );
                mp = (metadata_piece *)
                     ::std::
                     vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                     ::end(&(this->m_requested_metadata).
                            super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                          );
                while (bVar4 = __gnu_cxx::operator!=
                                         (&__end4,(
                                                  __normal_iterator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece_*,_std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>_>
                                                  *)&mp), bVar4) {
                  peer.
                  super___shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       __gnu_cxx::
                       __normal_iterator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece_*,_std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>_>
                       ::operator*(&__end4);
                  ((reference)
                  peer.
                  super___shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->num_requests = 0;
                  ::std::weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>::lock
                            ((weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin> *
                             )local_d8);
                  bVar4 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d8);
                  if (bVar4) {
                    this_01 = ::std::
                              __shared_ptr_access<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_d8);
                    if (sVar14 == 1) {
                      local_f4 = 5;
                      ::std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                                ((duration<long,std::ratio<60l,1l>> *)&local_f0,&local_f4);
                      local_e8.__d.__r =
                           (duration)::std::chrono::operator+(&stack0xffffffffffffff60,&local_f0);
                    }
                    else {
                      local_e8.__d.__r = tStack_a0.__d.__r;
                    }
                    ut_metadata_peer_plugin::failed_hash_check(this_01,&local_e8);
                    local_dc = 0;
                  }
                  else {
                    local_dc = 3;
                  }
                  ::std::shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>::
                  ~shared_ptr((shared_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>
                               *)local_d8);
                  __gnu_cxx::
                  __normal_iterator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece_*,_std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>_>
                  ::operator++(&__end4);
                }
              }
              buf_local.m_len._7_1_ = false;
            }
          }
          else {
            buf_local.m_len._7_1_ = false;
          }
        }
      }
      else {
        this_00 = _total_size_local->m_pc;
        local_48 = metadata(this);
        uVar8 = span<const_char>::size(&local_48);
        libtorrent::aux::peer_connection::peer_log
                  (&this_00->super_peer_connection,info,"UT_METADATA",
                   "total_size: %d INCONSISTENT WITH: %d",(ulong)uVar2,uVar8 & 0xffffffff);
        buf_local.m_len._7_1_ = false;
      }
    }
  }
  return buf_local.m_len._7_1_;
}

Assistant:

bool ut_metadata_plugin::received_metadata(ut_metadata_peer_plugin& source
		, span<char const> buf, int const piece, int const total_size)
	{
		if (m_torrent.valid_metadata())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "already have metadata");
#endif
			m_torrent.add_redundant_bytes(static_cast<int>(buf.size()), aux::waste_reason::piece_unknown);
			return false;
		}

		if (m_metadata.empty())
		{
			// verify the total_size
			if (total_size <= 0 || total_size > m_torrent.session().settings().get_int(settings_pack::max_metadata_size))
			{
#ifndef TORRENT_DISABLE_LOGGING
				source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
					, "metadata size too big: %d", total_size);
#endif
// #error post alert
				return false;
			}

			m_metadata.resize(total_size);
			m_requested_metadata.resize(div_round_up(total_size, 16 * 1024));
		}

		if (piece < 0 || piece >= m_requested_metadata.end_index())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "piece: %d INVALID", piece);
#endif
			return false;
		}

		if (total_size != m_metadata.end_index())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "total_size: %d INCONSISTENT WITH: %d"
				, total_size, int(metadata().size()));
#endif
			// they disagree about the size!
			return false;
		}

		if (piece * 16 * 1024 + buf.size() > metadata().size())
		{
			// this piece is invalid
			return false;
		}

		std::memcpy(&m_metadata[piece * 16 * 1024], buf.data(), aux::numeric_cast<std::size_t>(buf.size()));
		// mark this piece has 'have'
		m_requested_metadata[piece].num_requests = std::numeric_limits<int>::max();
		m_requested_metadata[piece].source = source.shared_from_this();

		bool have_all = std::all_of(m_requested_metadata.begin(), m_requested_metadata.end()
			, [](metadata_piece const& mp) { return mp.num_requests == std::numeric_limits<int>::max(); });

		if (!have_all) return false;

		if (!m_torrent.set_metadata(m_metadata))
		{
			if (!m_torrent.valid_metadata())
			{
				time_point const now = aux::time_now();
				// any peer that we downloaded metadata from gets a random time
				// penalty, from 5 to 30 seconds or so. During this time we don't
				// make any metadata requests from those peers (to mix it up a bit
				// of which peers we use)
				// if we only have one block, and thus requested it from a single
				// peer, we bump up the retry time a lot more to try other peers
				bool single_peer = m_requested_metadata.size() == 1;
				for (auto& mp : m_requested_metadata)
				{
					mp.num_requests = 0;
					auto peer = mp.source.lock();
					if (!peer) continue;

					peer->failed_hash_check(single_peer ? now + minutes(5) : now);
				}
			}
			return false;
		}

		// free our copy of the metadata and get a reference
		// to the torrent's copy instead. No need to keep two
		// identical copies around
		m_metadata.clear();
		m_metadata.shrink_to_fit();

		// clear the storage for the bitfield
		m_requested_metadata.clear();
		m_requested_metadata.shrink_to_fit();

		return true;
	}